

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase<long>(Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,key_arg<long> *key)

{
  iterator pos;
  bool bVar1;
  iterator local_80;
  Node *local_68;
  Node *local_60;
  InnerMap *local_58;
  iterator local_50;
  undefined1 local_38 [8];
  iterator it;
  key_arg<long> *key_local;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find<long>((iterator *)local_38,this,key);
  end(&local_50,this);
  bVar1 = protobuf::operator==((iterator *)local_38,&local_50);
  if (!bVar1) {
    local_68 = (Node *)local_38;
    local_60 = it.it_.node_;
    local_58 = it.it_.m_;
    pos.it_.m_ = (InnerMap *)it.it_.node_;
    pos.it_.node_ = (Node *)local_38;
    pos.it_.bucket_index_ = (size_type)it.it_.m_;
    erase(&local_80,this,pos);
  }
  this_local = (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(ulong)!bVar1;
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_arg<K>& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }